

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers_test.cpp
# Opt level: O1

void flatbuffers::tests::FlexBuffersFloatingPointTest(void)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  double dVar5;
  Vector jvec;
  Map jmap;
  Reference jroot;
  Builder slb;
  Parser parser;
  Vector local_b88;
  Map local_b70;
  Reference local_b58;
  Builder local_b48;
  Reference local_aa8;
  pointer local_a98;
  ulong local_a90;
  size_t local_a88;
  _Alloc_hider local_a80;
  size_type local_a78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a70;
  _Alloc_hider local_a60;
  Parser local_788;
  
  flexbuffers::Builder::Builder(&local_b48,0x200,BUILDER_FLAG_SHARE_KEYS_AND_STRINGS);
  IDLOptions::IDLOptions((IDLOptions *)&local_a98);
  Parser::Parser(&local_788,(IDLOptions *)&local_a98);
  IDLOptions::~IDLOptions((IDLOptions *)&local_a98);
  flexbuffers::Builder::Clear(&local_b48);
  bVar1 = Parser::ParseFlexBuffer
                    (&local_788,"{ a: [1.0, nan, inf, infinity, -inf, +inf, -infinity, 8.0] }",
                     (char *)0x0,&local_b48);
  TestEq<bool,bool>(bVar1,true,"\'parser.ParseFlexBuffer(jsontest, nullptr, &slb)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xb5,"");
  if (local_b48.finished_ == false) {
    __assert_fail("finished_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x592,"void flexbuffers::Builder::Finished() const");
  }
  local_a90 = (long)local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_b58.data_ =
       local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish +
       (-2 - (ulong)local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]);
  local_b58._8_8_ =
       (1L << (local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish[-2] & 3)) << 8 |
       (ulong)(local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish[-2] >> 2) << 0x20 |
       (ulong)local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1];
  local_a98 = local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_a88 = 0;
  local_a80._M_p = (pointer)0x40;
  local_a78 = 0;
  local_a70._M_local_buf[8] = '\x01';
  local_a60._M_p = (pointer)0x0;
  local_a70._M_allocated_capacity = local_a90;
  if ((int)local_a90 == 0x7fffffff) {
    __assert_fail("static_cast<int32_t>(size_) < FLATBUFFERS_MAX_BUFFER_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x6c0,
                  "flexbuffers::Verifier::Verifier(const uint8_t *, size_t, std::vector<uint8_t> *, bool, size_t)"
                 );
  }
  bVar1 = flexbuffers::Verifier::VerifyBuffer((Verifier *)&local_a98);
  TestEq<bool,bool>(bVar1,true,
                    "\'flexbuffers::VerifyBuffer(slb.GetBuffer().data(), slb.GetBuffer().size(), nullptr)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xb9,"");
  flexbuffers::Reference::AsMap(&local_b70,&local_b58);
  flexbuffers::Map::Keys((TypedVector *)&local_a98,&local_b70);
  uVar2 = local_a90._0_1_ - 1;
  if ((7 < (byte)uVar2) || ((0x8bU >> (uVar2 & 0x1f) & 1) == 0)) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x396,"Reference flexbuffers::Map::operator[](const char *) const");
  }
  pvVar3 = bsearch("a",local_a98,local_a88,local_a90 & 0xff,
                   (__compar_fn_t)(&PTR_KeyCompare<unsigned_char>_00200f10)[uVar2 & 0xff]);
  local_aa8._8_8_ = 0x101;
  if (pvVar3 != (void *)0x0) {
    uVar4 = ((long)pvVar3 - (long)local_a98) / (long)(local_a90 & 0xff);
    if (uVar4 < local_b70.super_Vector.super_Sized.size_) {
      local_aa8._8_8_ = ZEXT18(local_b70.super_Vector.super_Sized.super_Object.byte_width_);
      local_aa8.data_ =
           local_b70.super_Vector.super_Sized.super_Object.data_ + uVar4 * local_aa8._8_8_;
      local_aa8._8_8_ =
           (1L << (local_b70.super_Vector.super_Sized.super_Object.data_
                   [uVar4 + local_b70.super_Vector.super_Sized.size_ * local_aa8._8_8_] & 3)) << 8 |
           (ulong)(local_b70.super_Vector.super_Sized.super_Object.data_
                   [uVar4 + local_b70.super_Vector.super_Sized.size_ * local_aa8._8_8_] >> 2) <<
           0x20 | local_aa8._8_8_;
      goto LAB_0015e3e8;
    }
  }
  local_aa8.data_ = (uint8_t *)0x0;
LAB_0015e3e8:
  flexbuffers::Reference::AsVector(&local_b88,&local_aa8);
  TestEq<int,unsigned_long>
            (8,local_b88.super_Sized.size_,"\'8\' != \'jvec.size()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbc,"");
  if (local_b88.super_Sized.size_ == 0) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ *
                         local_b88.super_Sized.super_Object.byte_width_] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ *
                         local_b88.super_Sized.super_Object.byte_width_] >> 2) << 0x20 |
                (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<double,double>
            (1.0,dVar5,"\'1.0\' != \'jvec[0].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbd,"");
  if (local_b88.super_Sized.size_ < 2) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_ + local_a90;
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 1] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 1] >> 2) << 0x20 | local_a90;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<bool,bool>(true,(~(ulong)dVar5 & 0x7ff8000000000000) == 0,
                    "\'true\' != \'is_quiet_nan(jvec[1].AsDouble())\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xbe,"");
  if (local_b88.super_Sized.size_ < 3) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_ + local_a90 * 2;
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 2] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 2] >> 2) << 0x20 | local_a90;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<double,double>
            (INFINITY,dVar5,"\'infinity_d\' != \'jvec[2].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbf,"");
  if (local_b88.super_Sized.size_ < 4) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_ + local_a90 * 3;
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 3] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 3] >> 2) << 0x20 | local_a90;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<double,double>
            (INFINITY,dVar5,"\'infinity_d\' != \'jvec[3].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc0,"");
  if (local_b88.super_Sized.size_ < 5) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_ + local_a90 * 4;
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 4] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 4] >> 2) << 0x20 | local_a90;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<double,double>
            (-INFINITY,dVar5,"\'-infinity_d\' != \'jvec[4].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc1,"");
  if (local_b88.super_Sized.size_ < 6) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_ + local_a90 * 5;
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 5] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 5] >> 2) << 0x20 | local_a90;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<double,double>
            (INFINITY,dVar5,"\'+infinity_d\' != \'jvec[5].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc2,"");
  if (local_b88.super_Sized.size_ < 7) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_ + local_a90 * 6;
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 6] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 6] >> 2) << 0x20 | local_a90;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<double,double>
            (-INFINITY,dVar5,"\'-infinity_d\' != \'jvec[6].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc3,"");
  if (local_b88.super_Sized.size_ < 8) {
    local_a90 = 0x101;
    local_a98 = (uint8_t *)0x0;
  }
  else {
    local_a90 = (ulong)local_b88.super_Sized.super_Object.byte_width_;
    local_a98 = local_b88.super_Sized.super_Object.data_ + local_a90 * 7;
    local_a90 = (1L << (local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 7] & 3)) << 8 |
                (ulong)(local_b88.super_Sized.super_Object.data_
                        [local_b88.super_Sized.size_ * local_a90 + 7] >> 2) << 0x20 | local_a90;
  }
  dVar5 = flexbuffers::Reference::AsDouble((Reference *)&local_a98);
  TestEq<double,double>
            (8.0,dVar5,"\'8.0\' != \'jvec[7].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc4,"");
  Parser::~Parser(&local_788);
  std::
  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&local_b48.string_pool._M_t);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_b48.key_pool._M_t);
  if (local_b48.stack_.
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b48.stack_.
                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b48.stack_.
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b48.stack_.
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b48.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b48.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b48.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FlexBuffersFloatingPointTest() {
#if defined(FLATBUFFERS_HAS_NEW_STRTOD) && (FLATBUFFERS_HAS_NEW_STRTOD > 0)
  flexbuffers::Builder slb(512,
                           flexbuffers::BUILDER_FLAG_SHARE_KEYS_AND_STRINGS);
  // Parse floating-point values from JSON:
  flatbuffers::Parser parser;
  slb.Clear();
  auto jsontest =
      "{ a: [1.0, nan, inf, infinity, -inf, +inf, -infinity, 8.0] }";
  TEST_EQ(parser.ParseFlexBuffer(jsontest, nullptr, &slb), true);
  auto jroot = flexbuffers::GetRoot(slb.GetBuffer());
  TEST_EQ(flexbuffers::VerifyBuffer(slb.GetBuffer().data(),
                                    slb.GetBuffer().size(), nullptr),
          true);
  auto jmap = jroot.AsMap();
  auto jvec = jmap["a"].AsVector();
  TEST_EQ(8, jvec.size());
  TEST_EQ(1.0, jvec[0].AsDouble());
  TEST_ASSERT(is_quiet_nan(jvec[1].AsDouble()));
  TEST_EQ(infinity_d, jvec[2].AsDouble());
  TEST_EQ(infinity_d, jvec[3].AsDouble());
  TEST_EQ(-infinity_d, jvec[4].AsDouble());
  TEST_EQ(+infinity_d, jvec[5].AsDouble());
  TEST_EQ(-infinity_d, jvec[6].AsDouble());
  TEST_EQ(8.0, jvec[7].AsDouble());
#endif
}